

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool __thiscall FSlide::BounceTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  double dVar1;
  double dVar2;
  line_t *line;
  int iVar3;
  intercept_t *piVar4;
  DVector2 local_118;
  FPathTraverse it;
  FLineOpening open;
  
  FPathTraverse::FPathTraverse(&it,start->X,start->Y,end->X,end->Y,1,0.0);
  do {
    while( true ) {
      while( true ) {
        piVar4 = FPathTraverse::Next(&it);
        if (piVar4 == (intercept_t *)0x0) goto LAB_004af673;
        if (piVar4->isaline != false) break;
        Printf("PTR_BounceTraverse: not a line?");
      }
      line = (piVar4->d).line;
      if ((ulong)((long)line - (long)lines) % 0x98 != 0) {
        __assert_fail("((size_t)li - (size_t)lines) % sizeof(line_t) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                      ,0xc40,"bool FSlide::BounceTraverse(const DVector2 &, const DVector2 &)");
      }
      if ((short)line->flags < 0) goto LAB_004af64f;
      if (((line->flags & 4) == 0) || (line->backsector == (sector_t *)0x0)) break;
      local_118.X = piVar4->frac * it.trace.dx + it.trace.x;
      local_118.Y = piVar4->frac * it.trace.dy + it.trace.y;
      P_LineOpening(&open,this->slidemo,line,&local_118,(DVector2 *)0x0,0);
      dVar1 = this->slidemo->Height;
      if ((open.range < dVar1) ||
         ((dVar2 = (this->slidemo->__Pos).Z, open.top < dVar1 + dVar2 || (dVar2 < open.bottom))))
      goto LAB_004af64f;
    }
    local_118.X = (this->slidemo->__Pos).X;
    local_118.Y = (this->slidemo->__Pos).Y;
    iVar3 = P_PointOnLineSide(&local_118,line);
  } while (iVar3 != 0);
LAB_004af64f:
  dVar1 = piVar4->frac;
  if (dVar1 < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = dVar1;
    this->bestslideline = line;
  }
LAB_004af673:
  FPathTraverse::~FPathTraverse(&it);
  return piVar4 == (intercept_t *)0x0;
}

Assistant:

bool FSlide::BounceTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{

		line_t  *li;

		if (!in->isaline)
		{
			Printf("PTR_BounceTraverse: not a line?");
			continue;
		}

		li = in->d.line;
		assert(((size_t)li - (size_t)lines) % sizeof(line_t) == 0);
		if (li->flags & ML_BLOCKEVERYTHING)
		{
			goto bounceblocking;
		}
		if (!(li->flags&ML_TWOSIDED) || !li->backsector)
		{
			if (P_PointOnLineSide(slidemo->Pos(), li))
				continue;			// don't hit the back side
			goto bounceblocking;
		}


		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));	// set openrange, opentop, openbottom
		if (open.range < slidemo->Height)
			goto bounceblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto bounceblocking;				// mobj is too high

		if (open.bottom > slidemo->Z())
			goto bounceblocking;				// mobj is too low

		continue;			// this line doesn't block movement

		// the line does block movement, see if it is closer than best so far
	bounceblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}
		return false;   // stop
	}
	return true;
}